

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

void bcf_sr_destroy1(bcf_sr_t *reader)

{
  int local_14;
  int j;
  bcf_sr_t *reader_local;
  
  if (reader->tbx_idx != (tbx_t *)0x0) {
    tbx_destroy(reader->tbx_idx);
  }
  if (reader->bcf_idx != (hts_idx_t *)0x0) {
    hts_idx_destroy(reader->bcf_idx);
  }
  bcf_hdr_destroy(reader->header);
  hts_close(reader->file);
  if (reader->itr != (hts_itr_t *)0x0) {
    hts_itr_destroy(reader->itr);
  }
  for (local_14 = 0; local_14 < reader->mbuffer; local_14 = local_14 + 1) {
    bcf_destroy(reader->buffer[local_14]);
  }
  free(reader->buffer);
  free(reader->samples);
  free(reader->filter_ids);
  return;
}

Assistant:

static void bcf_sr_destroy1(bcf_sr_t *reader)
{
    if ( reader->tbx_idx ) tbx_destroy(reader->tbx_idx);
    if ( reader->bcf_idx ) hts_idx_destroy(reader->bcf_idx);
    bcf_hdr_destroy(reader->header);
    hts_close(reader->file);
    if ( reader->itr ) tbx_itr_destroy(reader->itr);
    int j;
    for (j=0; j<reader->mbuffer; j++)
        bcf_destroy1(reader->buffer[j]);
    free(reader->buffer);
    free(reader->samples);
    free(reader->filter_ids);
}